

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O3

vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> * __thiscall
mxx::all2allv<std::pair<int,double>>
          (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
           *__return_storage_ptr__,mxx *this,pair<int,_double> *msgs,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *send_sizes,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes,comm *comm)

{
  pointer puVar1;
  pointer puVar2;
  uint uVar3;
  ulong __n;
  allocator_type local_29;
  
  puVar2 = (send_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (send_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  __n = 0;
  if (puVar2 != puVar1) {
    do {
      uVar3 = (int)__n + (int)*puVar2;
      __n = (ulong)uVar3;
      puVar2 = puVar2 + 1;
    } while (puVar2 != puVar1);
    __n = (ulong)(int)uVar3;
  }
  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
            (__return_storage_ptr__,__n,&local_29);
  all2allv<std::pair<int,double>>
            ((pair<int,_double> *)this,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)msgs
             ,(__return_storage_ptr__->
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
              _M_impl.super__Vector_impl_data._M_start,send_sizes,(comm *)recv_sizes);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> all2allv(const T* msgs, const std::vector<size_t>& send_sizes, const std::vector<size_t>& recv_sizes, const mxx::comm& comm = mxx::comm()) {
    size_t recv_size = std::accumulate(recv_sizes.begin(), recv_sizes.end(), 0);
    std::vector<T> result(recv_size);
    all2allv(msgs, send_sizes, &result[0], recv_sizes, comm);
    return result;
}